

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::WaitRTL8211F_Idle(FpgaIO *this,char *callerName,uint chan,uint loop_cnt)

{
  BasePort *pBVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  int iVar8;
  quadlet_t read_data;
  uint local_3c;
  char *local_38;
  
  local_38 = callerName;
  Amp1394_Sleep(0.001);
  iVar8 = loop_cnt + 1;
  do {
    pcVar4 = local_38;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      if (local_38 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12a258);
      }
      else {
        sVar6 = strlen(local_38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," timeout waiting for idle, cnt ",0x1f);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", read ",7);
      *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      lVar2 = *(long *)poVar7;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar7 + lVar3 + 0x18) = *(uint *)(poVar7 + lVar3 + 0x18) & 0xffffffb5 | 2;
      std::ios::widen((char)*(undefined8 *)(lVar2 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      break;
    }
    pBVar1 = (this->super_BoardIO).port;
    iVar5 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,(ulong)(chan << 8 | 0x40a0),
                       &local_3c);
  } while (((char)iVar5 == '\0') || ((local_3c & 0x7000000) != 0));
  return iVar8 != 0;
}

Assistant:

bool FpgaIO::WaitRTL8211F_Idle(const char *callerName, unsigned int chan, unsigned int loop_cnt)
{
    // Should have firmware/hardware checks
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, check up to loop_cnt iterations
    nodeaddr_t address = 0x40a0 | (chan << 8);
    quadlet_t read_data;
    bool isIdle = false;
    unsigned int i = 0;
    while (!isIdle && (i++ < loop_cnt)) {
        if (port->ReadQuadlet(BoardId, address, read_data))
            isIdle = ((read_data&0x07000000) == 0);
    }
    if (!isIdle) {
        std::cout << callerName << " timeout waiting for idle, cnt " << i << ", read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    return isIdle;
}